

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * __thiscall Catch::Runner::runTests(Runner *this)

{
  bool bVar1;
  int iVar2;
  Config *pCVar3;
  IRegistryHub *pIVar4;
  undefined4 extraout_var;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *this_00;
  undefined4 extraout_var_00;
  iterator totals;
  iterator groupsCount;
  reference pTVar6;
  Ptr<Catch::Config> *in_RSI;
  Totals *in_RDI;
  pair<std::_Rb_tree_const_iterator<Catch::TestCase>,_bool> pVar7;
  const_iterator itEnd_1;
  const_iterator it_1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> skippedTestCases;
  const_iterator itEnd;
  const_iterator it;
  int testsRunForGroup;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> testCases;
  TestSpec testSpec;
  RunContext context;
  Totals *in_stack_fffffffffffffaf8;
  allocator *paVar8;
  RunContext *in_stack_fffffffffffffb00;
  TestSpecParser *in_stack_fffffffffffffb08;
  value_type *__x;
  undefined7 in_stack_fffffffffffffb20;
  undefined1 in_stack_fffffffffffffb27;
  string *in_stack_fffffffffffffb28;
  undefined7 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb37;
  size_t in_stack_fffffffffffffb48;
  size_t in_stack_fffffffffffffb50;
  string *in_stack_fffffffffffffb58;
  RunContext *in_stack_fffffffffffffb60;
  RunContext *this_01;
  allocator local_461;
  string local_460 [16];
  Ptr<Catch::IStreamingReporter> *in_stack_fffffffffffffbb0;
  Ptr<const_Catch::IConfig> *in_stack_fffffffffffffbb8;
  RunContext *in_stack_fffffffffffffbc0;
  size_t in_stack_fffffffffffffbc8;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  in_stack_fffffffffffffbd8;
  RunContext *in_stack_fffffffffffffbe0;
  _Self local_3c8;
  _Self local_3c0;
  TestCase *local_3b8;
  TestCase *local_3a8;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_3a0;
  int local_394;
  undefined1 local_390 [31];
  allocator local_371;
  string local_370 [168];
  undefined1 local_2c8 [31];
  allocator local_2a9;
  string local_2a8 [384];
  TestCase *in_stack_fffffffffffffed8;
  RunContext *in_stack_fffffffffffffee0;
  long *plVar5;
  
  Ptr<Catch::Config>::get(in_RSI);
  this_01 = (RunContext *)(local_2a8 + 0x30);
  Ptr<const_Catch::IConfig>::Ptr
            ((Ptr<const_Catch::IConfig> *)in_stack_fffffffffffffb00,
             (IConfig *)in_stack_fffffffffffffaf8);
  RunContext::RunContext
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  Ptr<const_Catch::IConfig>::~Ptr((Ptr<const_Catch::IConfig> *)in_stack_fffffffffffffb00);
  Totals::Totals((Totals *)in_stack_fffffffffffffb00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"all tests",&local_2a9);
  RunContext::testGroupStarting
            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
             in_stack_fffffffffffffb48);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  pCVar3 = Ptr<Catch::Config>::operator->(in_RSI);
  (*(pCVar3->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
    _vptr_NonCopyable[0xd])();
  TestSpec::TestSpec((TestSpec *)in_stack_fffffffffffffb00,(TestSpec *)in_stack_fffffffffffffaf8);
  bVar1 = TestSpec::hasFilters((TestSpec *)0x252435);
  if (!bVar1) {
    ITagAliasRegistry::get();
    TestSpecParser::TestSpecParser
              ((TestSpecParser *)in_stack_fffffffffffffb00,
               (ITagAliasRegistry *)in_stack_fffffffffffffaf8);
    paVar8 = &local_371;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_370,"~[.]",paVar8);
    TestSpecParser::parse
              ((TestSpecParser *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb28);
    TestSpecParser::testSpec(in_stack_fffffffffffffb08);
    TestSpec::operator=((TestSpec *)in_stack_fffffffffffffb00,(TestSpec *)in_stack_fffffffffffffaf8)
    ;
    TestSpec::~TestSpec((TestSpec *)0x2524d3);
    std::__cxx11::string::~string(local_370);
    std::allocator<char>::~allocator((allocator<char> *)&local_371);
    TestSpecParser::~TestSpecParser((TestSpecParser *)in_stack_fffffffffffffb00);
  }
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)0x252603);
  pIVar4 = getRegistryHub();
  iVar2 = (*pIVar4->_vptr_IRegistryHub[3])();
  plVar5 = (long *)CONCAT44(extraout_var,iVar2);
  pCVar3 = Ptr<Catch::Config>::operator*(in_RSI);
  (**(code **)(*plVar5 + 0x18))(plVar5,local_2c8,pCVar3,local_390,0);
  local_394 = 0;
  local_3a8 = (TestCase *)
              std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                        ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                         in_stack_fffffffffffffaf8);
  __gnu_cxx::
  __normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
  ::__normal_iterator<Catch::TestCase*>
            ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)in_stack_fffffffffffffb00,
             (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)in_stack_fffffffffffffaf8);
  local_3b8 = (TestCase *)
              std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                        ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                         in_stack_fffffffffffffaf8);
  __gnu_cxx::
  __normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
  ::__normal_iterator<Catch::TestCase*>
            ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)in_stack_fffffffffffffb00,
             (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)in_stack_fffffffffffffaf8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)in_stack_fffffffffffffb00,
                            (__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)in_stack_fffffffffffffaf8), bVar1) {
    local_394 = local_394 + 1;
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator*(&local_3a0);
    local_3c0._M_node =
         (_Base_ptr)
         std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::
         find((set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_> *)
              in_stack_fffffffffffffb08,(key_type *)in_stack_fffffffffffffb00);
    local_3c8._M_node =
         (_Base_ptr)
         std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::
         end((set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_> *)
             in_stack_fffffffffffffaf8);
    bVar1 = std::operator==(&local_3c0,&local_3c8);
    if (bVar1) {
      bVar1 = RunContext::aborting(in_stack_fffffffffffffb00);
      if (bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
      ::operator*(&local_3a0);
      RunContext::runTest(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      Totals::operator+=((Totals *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      __x = (value_type *)(in_RSI + 0x42);
      __gnu_cxx::
      __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
      ::operator*(&local_3a0);
      pVar7 = std::
              set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::
              insert((set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
                      *)CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20),__x);
      in_stack_fffffffffffffb27 = pVar7.second;
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&local_3a0);
  }
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)0x252849);
  this_00 = (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)getRegistryHub();
  iVar2 = (**(code **)((long)&(((this_00->
                                super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>
                                )._M_impl.super__Vector_impl_data._M_start)->super_TestCaseInfo).
                              name.field_2 + 8))();
  plVar5 = (long *)CONCAT44(extraout_var_00,iVar2);
  pCVar3 = Ptr<Catch::Config>::operator*(in_RSI);
  (**(code **)(*plVar5 + 0x18))(plVar5,local_2c8,pCVar3,&stack0xfffffffffffffbe0,1);
  totals = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                     ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                      in_stack_fffffffffffffaf8);
  __gnu_cxx::
  __normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
  ::__normal_iterator<Catch::TestCase*>
            ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)in_stack_fffffffffffffb00,
             (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)in_stack_fffffffffffffaf8);
  groupsCount = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                          ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                           in_stack_fffffffffffffaf8);
  __gnu_cxx::
  __normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
  ::__normal_iterator<Catch::TestCase*>
            ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)in_stack_fffffffffffffb00,
             (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)in_stack_fffffffffffffaf8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)in_stack_fffffffffffffb00,
                            (__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)in_stack_fffffffffffffaf8), bVar1) {
    in_stack_fffffffffffffb00 =
         (RunContext *)
         Ptr<Catch::IStreamingReporter>::operator->
                   ((Ptr<Catch::IStreamingReporter> *)(in_RSI + 0x41));
    pTVar6 = __gnu_cxx::
             __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
             ::operator*((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                          *)&stack0xfffffffffffffbd8);
    (*(*(_func_int ***)&((TestCaseInfo *)&in_stack_fffffffffffffb00->super_IResultCapture)->name)
      [0x10])(in_stack_fffffffffffffb00,pTVar6);
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                  *)&stack0xfffffffffffffbd8);
  }
  paVar8 = &local_461;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_460,"all tests",paVar8);
  RunContext::testGroupEnded
            (in_stack_fffffffffffffbe0,(string *)in_stack_fffffffffffffbd8._M_current,
             (Totals *)totals._M_current,in_stack_fffffffffffffbc8,(size_t)groupsCount._M_current);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(this_00);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(this_00);
  TestSpec::~TestSpec((TestSpec *)0x252a0b);
  RunContext::~RunContext(this_01);
  return in_RDI;
}

Assistant:

Totals runTests() {

            RunContext context( m_config.get(), m_reporter );

            Totals totals;

            context.testGroupStarting( "all tests", 1, 1 ); // deprecated?

            TestSpec testSpec = m_config->testSpec();
            if( !testSpec.hasFilters() )
                testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "~[.]" ).testSpec(); // All not hidden tests

            std::vector<TestCase> testCases;
            getRegistryHub().getTestCaseRegistry().getFilteredTests( testSpec, *m_config, testCases );

            int testsRunForGroup = 0;
            for( std::vector<TestCase>::const_iterator it = testCases.begin(), itEnd = testCases.end();
                    it != itEnd;
                    ++it ) {
                testsRunForGroup++;
                if( m_testsAlreadyRun.find( *it ) == m_testsAlreadyRun.end() ) {

                    if( context.aborting() )
                        break;

                    totals += context.runTest( *it );
                    m_testsAlreadyRun.insert( *it );
                }
            }
            std::vector<TestCase> skippedTestCases;
            getRegistryHub().getTestCaseRegistry().getFilteredTests( testSpec, *m_config, skippedTestCases, true );

            for( std::vector<TestCase>::const_iterator it = skippedTestCases.begin(), itEnd = skippedTestCases.end();
                    it != itEnd;
                    ++it )
                m_reporter->skipTest( *it );

            context.testGroupEnded( "all tests", totals, 1, 1 );
            return totals;
        }